

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkAndLogCallValues
          (AtomicCounterTest *this,TestLog *log,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *increments,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *decrements,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *preGets,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *postGets,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *gets)

{
  Operation OVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer puVar9;
  uint uVar10;
  long *plVar11;
  TestLog *pTVar12;
  ulong *puVar13;
  long lVar14;
  int *piVar15;
  int *piVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int ndx;
  uint uVar23;
  int iVar24;
  bool bVar25;
  vector<unsigned_int,_std::allocator<unsigned_int>_> decrementCounts;
  ScopedLogSection valueCheck;
  ScopedLogSection uniquenesCheck_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterDecrements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterIncrements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterPostGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterPreGets;
  ostringstream s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterGets;
  long *local_3f0 [2];
  long local_3e0 [2];
  TestLog *local_3d0;
  long *local_3c8;
  undefined8 local_3c0;
  long local_3b8;
  undefined8 uStack_3b0;
  uint local_3a4;
  long *local_3a0;
  long local_398;
  long local_390;
  long lStack_388;
  long *local_380;
  long local_378;
  long local_370;
  long lStack_368;
  allocator<char> local_359;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  ulong *local_338;
  long local_330;
  ulong local_328;
  long lStack_320;
  string local_318;
  string local_2f0;
  ScopedLogSection local_2d0;
  long local_2c8;
  TestLog local_2c0;
  long lStack_2b8;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0 [2];
  ScopedLogSection local_290;
  long *local_288 [2];
  long local_278 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  int local_22c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  undefined1 local_1e8 [8];
  _func_int **pp_Stack_1e0;
  pointer local_1d8;
  ios_base local_178 [8];
  ios_base local_170 [264];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  iVar21 = (this->m_spec).atomicCounterCount;
  if (iVar21 < 1) {
    bVar5 = 1;
  }
  else {
    local_3a4 = (uint)CONCAT71((int7)((ulong)increments >> 8),1);
    ndx = 0;
    local_3d0 = log;
    local_50 = postGets;
    local_48 = preGets;
    local_40 = decrements;
    local_38 = increments;
    do {
      local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      getCountersValues(&local_248,local_38,ndx,iVar21);
      getCountersValues(&local_268,local_40,ndx,(this->m_spec).atomicCounterCount);
      getCountersValues(&local_208,local_48,ndx,(this->m_spec).atomicCounterCount);
      getCountersValues(&local_228,local_50,ndx,(this->m_spec).atomicCounterCount);
      getCountersValues(&local_68,gets,ndx,(this->m_spec).atomicCounterCount);
      OVar1 = (this->m_spec).operations;
      if (OVar1 == OPERATION_GET) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1b0253a);
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_348 = *plVar11;
          lStack_340 = plVar7[3];
          local_358 = &local_348;
        }
        else {
          local_348 = *plVar11;
          local_358 = (long *)*plVar7;
        }
        local_350 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_358);
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_370 = *plVar11;
          lStack_368 = plVar7[3];
          local_380 = &local_370;
        }
        else {
          local_370 = *plVar11;
          local_380 = (long *)*plVar7;
        }
        local_378 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,(char *)local_380,(allocator<char> *)local_288);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x1c8f10c);
        local_3c8 = &local_3b8;
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_3b8 = *plVar7;
          uStack_3b0 = puVar8[3];
        }
        else {
          local_3b8 = *plVar7;
          local_3c8 = (long *)*puVar8;
        }
        local_3c0 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_3a0 = &local_390;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_390 = *plVar11;
          lStack_388 = plVar7[3];
        }
        else {
          local_390 = *plVar11;
          local_3a0 = (long *)*plVar7;
        }
        local_398 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
        tcu::ScopedLogSection::ScopedLogSection(&local_2d0,local_3d0,&local_318,&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390 + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380,local_370 + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if (local_3f0[0] != local_3e0) {
          operator_delete(local_3f0[0],local_3e0[0] + 1);
        }
        puVar9 = (gets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(gets->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) >> 2) < 1)
        {
          iVar21 = 0;
        }
        else {
          lVar14 = 0;
          iVar21 = 0;
          do {
            if ((((this->m_spec).useBranches != true) || (puVar9[lVar14] != 0xffffffff)) &&
               (puVar9[lVar14] != (this->m_spec).threadCount * (this->m_spec).callCount + 1U)) {
              if (iVar21 < 0x14) {
                local_1e8 = (undefined1  [8])local_3d0;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0,"atomicCounter(counter",0x15);
                std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0,") returned ",0xb);
                std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0," expected ",10);
                std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1e0);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
                std::ios_base::~ios_base(local_170);
              }
              iVar21 = iVar21 + 1;
              local_3a4 = 0;
            }
            lVar14 = lVar14 + 1;
            puVar9 = (gets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_start;
          } while (lVar14 < (int)((ulong)((long)(gets->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)puVar9) >> 2));
        }
        if (iVar21 == 0) {
          local_1e8 = (undefined1  [8])local_3d0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,"All values returned by atomicCounter(counter",0x2c);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,") match initial value ",0x16);
          std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,".",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_014668a4:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
          std::ios_base::~ios_base(local_170);
        }
        else if (0x14 < iVar21) {
          local_1e8 = (undefined1  [8])local_3d0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,
                     "Total number of invalid values returned by atomicCounter(counter",0x40);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,") ",2);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,iVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0," displaying first 20 values.",0x1c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_014668a4;
        }
        tcu::TestLog::endSection(local_2d0.m_log);
      }
      else {
        if ((~OVar1 & 3) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1b0253a);
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_348 = *plVar11;
            lStack_340 = plVar7[3];
            local_358 = &local_348;
          }
          else {
            local_348 = *plVar11;
            local_358 = (long *)*plVar7;
          }
          local_350 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_358);
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_370 = *plVar11;
            lStack_368 = plVar7[3];
            local_380 = &local_370;
          }
          else {
            local_370 = *plVar11;
            local_380 = (long *)*plVar7;
          }
          local_378 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,(char *)local_380,(allocator<char> *)local_288);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x1c8f1c9);
          local_3c8 = &local_3b8;
          plVar7 = puVar8 + 2;
          if ((long *)*puVar8 == plVar7) {
            local_3b8 = *plVar7;
            uStack_3b0 = puVar8[3];
          }
          else {
            local_3b8 = *plVar7;
            local_3c8 = (long *)*puVar8;
          }
          local_3c0 = puVar8[1];
          *puVar8 = plVar7;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
          local_3a0 = &local_390;
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_390 = *plVar11;
            lStack_388 = plVar7[3];
          }
          else {
            local_390 = *plVar11;
            local_3a0 = (long *)*plVar7;
          }
          local_398 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
          tcu::ScopedLogSection::ScopedLogSection(&local_2d0,local_3d0,&local_318,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if (local_3a0 != &local_390) {
            operator_delete(local_3a0,local_390 + 1);
          }
          if (local_3c8 != &local_3b8) {
            operator_delete(local_3c8,local_3b8 + 1);
          }
          if (local_338 != &local_328) {
            operator_delete(local_338,local_328 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if (local_380 != &local_370) {
            operator_delete(local_380,local_370 + 1);
          }
          if (local_358 != &local_348) {
            operator_delete(local_358,local_348 + 1);
          }
          if (local_3f0[0] != local_3e0) {
            operator_delete(local_3f0[0],local_3e0[0] + 1);
          }
          bVar25 = (this->m_spec).useBranches;
          local_22c = 0;
          iVar21 = 0;
          if (bVar25 == true) {
            iVar21 = (this->m_spec).callCount * (this->m_spec).threadCount;
            iVar21 = iVar21 - iVar21 / 2;
          }
          if (bVar25 != false) {
            local_22c = -(((this->m_spec).callCount * (this->m_spec).threadCount) / 2);
          }
          local_1e8 = (undefined1  [8])0x0;
          pp_Stack_1e0 = (_func_int **)0x0;
          uVar6 = 0;
          local_1d8 = (pointer)0x0;
          local_318.field_2._M_allocated_capacity = 0;
          local_318._M_dataplus._M_p = (pointer)0x0;
          local_318._M_string_length = 0;
          uVar23 = (uint)((ulong)((long)local_248.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_248.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
          if ((int)uVar23 < 1) {
            uVar18 = 0xffffffff;
          }
          else {
            uVar17 = 0;
            uVar18 = 0xffffffff;
            uVar6 = 0;
            do {
              uVar2 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar17];
              uVar10 = uVar18;
              if (uVar2 < uVar18) {
                uVar10 = uVar2;
              }
              uVar22 = uVar2;
              if (uVar2 < uVar6) {
                uVar22 = uVar6;
              }
              if (uVar2 == 0xffffffff) {
                uVar10 = uVar18;
                uVar22 = uVar6;
              }
              uVar6 = uVar22;
              uVar18 = uVar10;
              uVar17 = uVar17 + 1;
            } while ((uVar23 & 0x7fffffff) != uVar17);
          }
          uVar23 = (uint)((ulong)((long)local_268.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_268.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
          if (0 < (int)uVar23) {
            uVar17 = 0;
            do {
              uVar2 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar17];
              uVar10 = uVar18;
              if (uVar2 < uVar18) {
                uVar10 = uVar2;
              }
              uVar22 = uVar2;
              if (uVar2 < uVar6) {
                uVar22 = uVar6;
              }
              if (uVar2 == 0xffffffff) {
                uVar10 = uVar18;
                uVar22 = uVar6;
              }
              uVar6 = uVar22;
              uVar18 = uVar10;
              uVar17 = uVar17 + 1;
            } while ((uVar23 & 0x7fffffff) != uVar17);
          }
          uVar23 = (this->m_spec).threadCount * (this->m_spec).callCount + 1;
          if (uVar23 <= uVar18) {
            uVar18 = uVar23;
          }
          if (uVar6 <= uVar23) {
            uVar6 = uVar23;
          }
          uVar17 = (ulong)((uVar6 - uVar18) + 1);
          local_380 = (long *)((ulong)local_380 & 0xffffffff00000000);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,uVar17,
                     (value_type_conflict4 *)&local_380);
          local_380 = (long *)((ulong)local_380 & 0xffffffff00000000);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_318,uVar17,
                     (value_type_conflict4 *)&local_380);
          uVar6 = (uint)((ulong)((long)local_248.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_248.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2);
          if (0 < (int)uVar6) {
            uVar17 = 0;
            do {
              if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17] != 0xffffffff) {
                piVar16 = (int *)((long)(qpTestLog **)local_1e8 +
                                 (ulong)(local_248.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar17] - uVar18)
                                 * 4);
                *piVar16 = *piVar16 + 1;
              }
              uVar17 = uVar17 + 1;
            } while ((uVar6 & 0x7fffffff) != uVar17);
          }
          uVar6 = (uint)((ulong)((long)local_268.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_268.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2);
          if (0 < (int)uVar6) {
            uVar17 = 0;
            do {
              if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17] != 0xffffffff) {
                *(int *)(local_318._M_dataplus._M_p +
                        (ulong)(local_268.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar17] - uVar18) * 4) =
                     *(int *)(local_318._M_dataplus._M_p +
                             (ulong)(local_268.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar17] - uVar18) * 4
                             ) + 1;
              }
              uVar17 = uVar17 + 1;
            } while ((uVar6 & 0x7fffffff) != uVar17);
          }
          iVar24 = iVar21 + uVar23 + local_22c;
          iVar21 = uVar23 - uVar18;
          while( true ) {
            lVar14 = (long)iVar21;
            iVar19 = *(int *)((long)(qpTestLog **)local_1e8 + lVar14 * 4);
            iVar3 = *(int *)(local_318._M_dataplus._M_p + lVar14 * 4);
            uVar6 = (uint)((ulong)((long)pp_Stack_1e0 - (long)local_1e8) >> 2);
            if (iVar19 + iVar3 == 0) break;
            piVar16 = (int *)((long)(qpTestLog **)local_1e8 + lVar14 * 4);
            if ((iVar19 == 0) || (iVar20 = 1, iVar21 < (int)(iVar24 - uVar18))) {
              piVar15 = (int *)(local_318._M_dataplus._M_p + lVar14 * 4);
              iVar4 = iVar3;
              if (iVar3 == 0) {
                piVar15 = piVar16;
                iVar4 = iVar19;
              }
              if (iVar3 != 0 || iVar19 != 0) {
                iVar20 = (uint)(iVar3 == 0) * 2 + -1;
                piVar16 = piVar15;
                iVar19 = iVar4;
                goto LAB_01466eeb;
              }
            }
            else {
LAB_01466eeb:
              *piVar16 = iVar19 + -1;
              iVar21 = iVar21 + iVar20;
            }
            if ((iVar21 < 0) || ((int)uVar6 <= iVar21)) break;
          }
          bVar25 = iVar21 + uVar18 == iVar24;
          if (0 < (int)uVar6) {
            uVar17 = 0;
            do {
              if (*(int *)((long)(qpTestLog **)local_1e8 + uVar17 * 4) != 0) {
                bVar25 = false;
              }
              uVar17 = uVar17 + 1;
            } while ((uVar6 & 0x7fffffff) != uVar17);
          }
          uVar6 = (uint)(local_318._M_string_length - (long)local_318._M_dataplus._M_p >> 2);
          if (0 < (int)uVar6) {
            uVar17 = 0;
            do {
              if (*(int *)(local_318._M_dataplus._M_p + uVar17 * 4) != 0) {
                bVar25 = false;
              }
              uVar17 = uVar17 + 1;
            } while ((uVar6 & 0x7fffffff) != uVar17);
          }
          if (local_318._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_318._M_dataplus._M_p,
                            local_318.field_2._M_allocated_capacity -
                            (long)local_318._M_dataplus._M_p);
          }
          if (local_1e8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
          }
          if (bVar25) {
            local_1e8 = (undefined1  [8])local_3d0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,
                       "Found possible order of calls to atomicCounterIncrement(counter",0x3f);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,") and atomicCounterDecrement(counter",0x24);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
            std::ios_base::~ios_base(local_170);
          }
          else {
            local_1e8 = (undefined1  [8])local_3d0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,
                       "No possible order of calls to atomicCounterIncrement(counter",0x3c);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,") and atomicCounterDecrement(counter",0x24);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,") found.",8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
            std::ios_base::~ios_base(local_170);
            local_3a4 = 0;
          }
          tcu::TestLog::endSection(local_2d0.m_log);
          goto LAB_014686ff;
        }
        if ((OVar1 & OPERATION_INC) == 0) {
          if ((OVar1 & OPERATION_DEC) != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            std::ios_base::~ios_base(local_178);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1b0253a)
            ;
            plVar11 = plVar7 + 2;
            if ((long *)*plVar7 == plVar11) {
              local_348 = *plVar11;
              lStack_340 = plVar7[3];
              local_358 = &local_348;
            }
            else {
              local_348 = *plVar11;
              local_358 = (long *)*plVar7;
            }
            local_350 = plVar7[1];
            *plVar7 = (long)plVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_358);
            plVar11 = plVar7 + 2;
            if ((long *)*plVar7 == plVar11) {
              local_370 = *plVar11;
              lStack_368 = plVar7[3];
              local_380 = &local_370;
            }
            else {
              local_370 = *plVar11;
              local_380 = (long *)*plVar7;
            }
            local_378 = plVar7[1];
            *plVar7 = (long)plVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_318,(char *)local_380,(allocator<char> *)local_288);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            std::ios_base::~ios_base(local_178);
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x1c8f10c);
            local_3c8 = &local_3b8;
            plVar7 = puVar8 + 2;
            if ((long *)*puVar8 == plVar7) {
              local_3b8 = *plVar7;
              uStack_3b0 = puVar8[3];
            }
            else {
              local_3b8 = *plVar7;
              local_3c8 = (long *)*puVar8;
            }
            local_3c0 = puVar8[1];
            *puVar8 = plVar7;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
            local_3a0 = &local_390;
            plVar11 = plVar7 + 2;
            if ((long *)*plVar7 == plVar11) {
              local_390 = *plVar11;
              lStack_388 = plVar7[3];
            }
            else {
              local_390 = *plVar11;
              local_3a0 = (long *)*plVar7;
            }
            local_398 = plVar7[1];
            *plVar7 = (long)plVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
            tcu::ScopedLogSection::ScopedLogSection(&local_2d0,local_3d0,&local_318,&local_2f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_3a0 != &local_390) {
              operator_delete(local_3a0,local_390 + 1);
            }
            if (local_3c8 != &local_3b8) {
              operator_delete(local_3c8,local_3b8 + 1);
            }
            if (local_338 != &local_328) {
              operator_delete(local_338,local_328 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_380 != &local_370) {
              operator_delete(local_380,local_370 + 1);
            }
            if (local_358 != &local_348) {
              operator_delete(local_358,local_348 + 1);
            }
            if (local_3f0[0] != local_3e0) {
              operator_delete(local_3f0[0],local_3e0[0] + 1);
            }
            bVar25 = checkUniquenessAndLinearity(local_3d0,&local_268);
            if (bVar25) {
              local_1e8 = (undefined1  [8])local_3d0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1e0,"atomicCounterDecrement(counter",0x1e);
              std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1e0,") returned only unique values.",0x1e);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
              std::ios_base::~ios_base(local_170);
            }
            else {
              local_1e8 = (undefined1  [8])local_3d0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1e0,"atomicCounterDecrement(counter",0x1e);
              std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1e0,") returned non unique values.",0x1d);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
              std::ios_base::~ios_base(local_170);
              local_3a4 = 0;
            }
            tcu::TestLog::endSection(local_2d0.m_log);
            if (((local_3a4 & 1) != 0) && (((this->m_spec).operations & OPERATION_GET) != 0)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
              std::ios_base::~ios_base(local_178);
              plVar7 = (long *)std::__cxx11::string::replace
                                         ((ulong)local_3f0,0,(char *)0x0,0x1b0253a);
              plVar11 = plVar7 + 2;
              if ((long *)*plVar7 == plVar11) {
                local_348 = *plVar11;
                lStack_340 = plVar7[3];
                local_358 = &local_348;
              }
              else {
                local_348 = *plVar11;
                local_358 = (long *)*plVar7;
              }
              local_350 = plVar7[1];
              *plVar7 = (long)plVar11;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_358);
              plVar11 = plVar7 + 2;
              if ((long *)*plVar7 == plVar11) {
                local_370 = *plVar11;
                lStack_368 = plVar7[3];
                local_380 = &local_370;
              }
              else {
                local_370 = *plVar11;
                local_380 = (long *)*plVar7;
              }
              local_378 = plVar7[1];
              *plVar7 = (long)plVar11;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_318,(char *)local_380,&local_359);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
              std::ios_base::~ios_base(local_178);
              plVar7 = (long *)std::__cxx11::string::replace
                                         ((ulong)local_288,0,(char *)0x0,0x1c8f10c);
              local_2d0.m_log = &local_2c0;
              pTVar12 = (TestLog *)(plVar7 + 2);
              if ((TestLog *)*plVar7 == pTVar12) {
                local_2c0.m_log = pTVar12->m_log;
                lStack_2b8 = plVar7[3];
              }
              else {
                local_2c0.m_log = pTVar12->m_log;
                local_2d0.m_log = (TestLog *)*plVar7;
              }
              local_2c8 = plVar7[1];
              *plVar7 = (long)pTVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
              local_338 = &local_328;
              puVar13 = (ulong *)(plVar7 + 2);
              if ((ulong *)*plVar7 == puVar13) {
                local_328 = *puVar13;
                lStack_320 = plVar7[3];
              }
              else {
                local_328 = *puVar13;
                local_338 = (ulong *)*plVar7;
              }
              local_330 = plVar7[1];
              *plVar7 = (long)puVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
              std::ios_base::~ios_base(local_178);
              uVar17 = 0xf;
              if (local_338 != &local_328) {
                uVar17 = local_328;
              }
              if (uVar17 < (ulong)(local_2a8 + local_330)) {
                uVar17 = 0xf;
                if (local_2b0 != local_2a0) {
                  uVar17 = local_2a0[0];
                }
                if (uVar17 < (ulong)(local_2a8 + local_330)) goto LAB_01468319;
                puVar8 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_2b0,0,(char *)0x0,(ulong)local_338);
              }
              else {
LAB_01468319:
                puVar8 = (undefined8 *)
                         std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2b0);
              }
              local_3c8 = &local_3b8;
              plVar7 = puVar8 + 2;
              if ((long *)*puVar8 == plVar7) {
                local_3b8 = *plVar7;
                uStack_3b0 = puVar8[3];
              }
              else {
                local_3b8 = *plVar7;
                local_3c8 = (long *)*puVar8;
              }
              local_3c0 = puVar8[1];
              *puVar8 = plVar7;
              puVar8[1] = 0;
              *(undefined1 *)plVar7 = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
              local_3a0 = &local_390;
              plVar11 = plVar7 + 2;
              if ((long *)*plVar7 == plVar11) {
                local_390 = *plVar11;
                lStack_388 = plVar7[3];
              }
              else {
                local_390 = *plVar11;
                local_3a0 = (long *)*plVar7;
              }
              local_398 = plVar7[1];
              *plVar7 = (long)plVar11;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
              tcu::ScopedLogSection::ScopedLogSection(&local_290,local_3d0,&local_318,&local_2f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if (local_3a0 != &local_390) {
                operator_delete(local_3a0,local_390 + 1);
              }
              if (local_3c8 != &local_3b8) {
                operator_delete(local_3c8,local_3b8 + 1);
              }
              if (local_2b0 != local_2a0) {
                operator_delete(local_2b0,local_2a0[0] + 1);
              }
              if (local_338 != &local_328) {
                operator_delete(local_338,local_328 + 1);
              }
              if (local_2d0.m_log != &local_2c0) {
                operator_delete(local_2d0.m_log,(ulong)((long)&(local_2c0.m_log)->flags + 1));
              }
              if (local_288[0] != local_278) {
                operator_delete(local_288[0],local_278[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
              }
              if (local_380 != &local_370) {
                operator_delete(local_380,local_370 + 1);
              }
              if (local_358 != &local_348) {
                operator_delete(local_358,local_348 + 1);
              }
              if (local_3f0[0] != local_3e0) {
                operator_delete(local_3f0[0],local_3e0[0] + 1);
              }
              bVar25 = checkRange(local_3d0,&local_268,&local_228,&local_208);
              if (bVar25) {
                local_1e8 = (undefined1  [8])local_3d0;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0,"atomicCounterDecrement(counter",0x1e);
                std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0,
                           ") returned only values between previous and next call to atomicCounter(counter"
                           ,0x4e);
                std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
                std::ios_base::~ios_base(local_170);
              }
              else {
                local_1e8 = (undefined1  [8])local_3d0;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0,"atomicCounterDecrement(counter",0x1e);
                std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0,
                           ") returned value that is not between previous and next call to atomicCounter(counter"
                           ,0x54);
                std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
                std::ios_base::~ios_base(local_170);
                local_3a4 = 0;
              }
              tcu::TestLog::endSection(local_290.m_log);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1b0253a);
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_348 = *plVar11;
            lStack_340 = plVar7[3];
            local_358 = &local_348;
          }
          else {
            local_348 = *plVar11;
            local_358 = (long *)*plVar7;
          }
          local_350 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_358);
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_370 = *plVar11;
            lStack_368 = plVar7[3];
            local_380 = &local_370;
          }
          else {
            local_370 = *plVar11;
            local_380 = (long *)*plVar7;
          }
          local_378 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,(char *)local_380,(allocator<char> *)local_288);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x1c8f10c);
          local_3c8 = &local_3b8;
          plVar7 = puVar8 + 2;
          if ((long *)*puVar8 == plVar7) {
            local_3b8 = *plVar7;
            uStack_3b0 = puVar8[3];
          }
          else {
            local_3b8 = *plVar7;
            local_3c8 = (long *)*puVar8;
          }
          local_3c0 = puVar8[1];
          *puVar8 = plVar7;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
          local_3a0 = &local_390;
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_390 = *plVar11;
            lStack_388 = plVar7[3];
          }
          else {
            local_390 = *plVar11;
            local_3a0 = (long *)*plVar7;
          }
          local_398 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
          tcu::ScopedLogSection::ScopedLogSection(&local_2d0,local_3d0,&local_318,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if (local_3a0 != &local_390) {
            operator_delete(local_3a0,local_390 + 1);
          }
          if (local_3c8 != &local_3b8) {
            operator_delete(local_3c8,local_3b8 + 1);
          }
          if (local_338 != &local_328) {
            operator_delete(local_338,local_328 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if (local_380 != &local_370) {
            operator_delete(local_380,local_370 + 1);
          }
          if (local_358 != &local_348) {
            operator_delete(local_358,local_348 + 1);
          }
          if (local_3f0[0] != local_3e0) {
            operator_delete(local_3f0[0],local_3e0[0] + 1);
          }
          bVar25 = checkUniquenessAndLinearity(local_3d0,&local_248);
          if (bVar25) {
            local_1e8 = (undefined1  [8])local_3d0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,"atomicCounterIncrement(counter",0x1e);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,") returned only unique values.",0x1e);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
            std::ios_base::~ios_base(local_170);
          }
          else {
            local_1e8 = (undefined1  [8])local_3d0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,"atomicCounterIncrement(counter",0x1e);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,") returned non unique values.",0x1d);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
            std::ios_base::~ios_base(local_170);
            local_3a4 = 0;
          }
          tcu::TestLog::endSection(local_2d0.m_log);
          if (((local_3a4 & 1) == 0) || (((this->m_spec).operations & OPERATION_GET) == 0))
          goto LAB_014686ff;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1b0253a);
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_348 = *plVar11;
            lStack_340 = plVar7[3];
            local_358 = &local_348;
          }
          else {
            local_348 = *plVar11;
            local_358 = (long *)*plVar7;
          }
          local_350 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_358);
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_370 = *plVar11;
            lStack_368 = plVar7[3];
            local_380 = &local_370;
          }
          else {
            local_370 = *plVar11;
            local_380 = (long *)*plVar7;
          }
          local_378 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,(char *)local_380,&local_359);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_288,0,(char *)0x0,0x1c8f10c);
          local_2d0.m_log = &local_2c0;
          pTVar12 = (TestLog *)(plVar7 + 2);
          if ((TestLog *)*plVar7 == pTVar12) {
            local_2c0.m_log = pTVar12->m_log;
            lStack_2b8 = plVar7[3];
          }
          else {
            local_2c0.m_log = pTVar12->m_log;
            local_2d0.m_log = (TestLog *)*plVar7;
          }
          local_2c8 = plVar7[1];
          *plVar7 = (long)pTVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
          local_338 = &local_328;
          puVar13 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar13) {
            local_328 = *puVar13;
            lStack_320 = plVar7[3];
          }
          else {
            local_328 = *puVar13;
            local_338 = (ulong *)*plVar7;
          }
          local_330 = plVar7[1];
          *plVar7 = (long)puVar13;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          uVar17 = 0xf;
          if (local_338 != &local_328) {
            uVar17 = local_328;
          }
          if (uVar17 < (ulong)(local_2a8 + local_330)) {
            uVar17 = 0xf;
            if (local_2b0 != local_2a0) {
              uVar17 = local_2a0[0];
            }
            if (uVar17 < (ulong)(local_2a8 + local_330)) goto LAB_01467ccf;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_338)
            ;
          }
          else {
LAB_01467ccf:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2b0);
          }
          local_3c8 = &local_3b8;
          plVar7 = puVar8 + 2;
          if ((long *)*puVar8 == plVar7) {
            local_3b8 = *plVar7;
            uStack_3b0 = puVar8[3];
          }
          else {
            local_3b8 = *plVar7;
            local_3c8 = (long *)*puVar8;
          }
          local_3c0 = puVar8[1];
          *puVar8 = plVar7;
          puVar8[1] = 0;
          *(undefined1 *)plVar7 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
          local_3a0 = &local_390;
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_390 = *plVar11;
            lStack_388 = plVar7[3];
          }
          else {
            local_390 = *plVar11;
            local_3a0 = (long *)*plVar7;
          }
          local_398 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
          tcu::ScopedLogSection::ScopedLogSection(&local_290,local_3d0,&local_318,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if (local_3a0 != &local_390) {
            operator_delete(local_3a0,local_390 + 1);
          }
          if (local_3c8 != &local_3b8) {
            operator_delete(local_3c8,local_3b8 + 1);
          }
          if (local_2b0 != local_2a0) {
            operator_delete(local_2b0,local_2a0[0] + 1);
          }
          if (local_338 != &local_328) {
            operator_delete(local_338,local_328 + 1);
          }
          if (local_2d0.m_log != &local_2c0) {
            operator_delete(local_2d0.m_log,(ulong)((long)&(local_2c0.m_log)->flags + 1));
          }
          if (local_288[0] != local_278) {
            operator_delete(local_288[0],local_278[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if (local_380 != &local_370) {
            operator_delete(local_380,local_370 + 1);
          }
          if (local_358 != &local_348) {
            operator_delete(local_358,local_348 + 1);
          }
          if (local_3f0[0] != local_3e0) {
            operator_delete(local_3f0[0],local_3e0[0] + 1);
          }
          bVar25 = checkRange(local_3d0,&local_248,&local_208,&local_228);
          if (bVar25) {
            local_1e8 = (undefined1  [8])local_3d0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,"atomicCounterIncrement(counter",0x1e);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,
                       ") returned only values between previous and next call to atomicCounter(counter"
                       ,0x4e);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
            std::ios_base::~ios_base(local_170);
          }
          else {
            local_1e8 = (undefined1  [8])local_3d0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,"atomicCounterIncrement(counter",0x1e);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,
                       ") returned value that is not between previous and next call to atomicCounter(counter"
                       ,0x54);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
            std::ios_base::~ios_base(local_170);
            local_3a4 = 0;
          }
          tcu::TestLog::endSection(local_290.m_log);
        }
      }
LAB_014686ff:
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_268.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ndx = ndx + 1;
      iVar21 = (this->m_spec).atomicCounterCount;
    } while (ndx < iVar21);
    bVar5 = (byte)local_3a4;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool AtomicCounterTest::checkAndLogCallValues (TestLog& log, const vector<deUint32>& increments, const vector<deUint32>& decrements, const vector<deUint32>& preGets, const vector<deUint32>& postGets, const vector<deUint32>& gets) const
{
	bool isOk = true;

	for (int counterNdx = 0; counterNdx < m_spec.atomicCounterCount; counterNdx++)
	{
		vector<deUint32> counterIncrements;
		vector<deUint32> counterDecrements;
		vector<deUint32> counterPreGets;
		vector<deUint32> counterPostGets;
		vector<deUint32> counterGets;

		getCountersValues(counterIncrements,	increments,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterDecrements,	decrements,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterPreGets,		preGets,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterPostGets,		postGets,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterGets,			gets,		counterNdx, m_spec.atomicCounterCount);

		if (m_spec.operations == OPERATION_GET)
		{
			tcu::ScopedLogSection valueCheck(log, ("counter" + de::toString(counterNdx) + " value check").c_str(), ("Check that counter" + de::toString(counterNdx) + " values haven't changed.").c_str());
			int changedValues = 0;

			for (int valueNdx = 0; valueNdx < (int)gets.size(); valueNdx++)
			{
				if ((!m_spec.useBranches || gets[valueNdx] != (deUint32)-1) && gets[valueNdx] != getInitialValue())
				{
					if (changedValues < 20)
						log << TestLog::Message << "atomicCounter(counter" << counterNdx << ") returned " << gets[valueNdx] << " expected " << getInitialValue() << TestLog::EndMessage;
					isOk = false;
					changedValues++;
				}
			}

			if (changedValues == 0)
				log << TestLog::Message << "All values returned by atomicCounter(counter" << counterNdx << ") match initial value " << getInitialValue() <<  "." << TestLog::EndMessage;
			else if (changedValues > 20)
				log << TestLog::Message << "Total number of invalid values returned by atomicCounter(counter" << counterNdx << ") " << changedValues << " displaying first 20 values." <<  TestLog::EndMessage;
		}
		else if ((m_spec.operations & (OPERATION_INC|OPERATION_DEC)) == (OPERATION_INC|OPERATION_DEC))
		{
			tcu::ScopedLogSection valueCheck(log, ("counter" + de::toString(counterNdx) + " path check").c_str(), ("Check that there is order in which counter" + de::toString(counterNdx) + " increments and decrements could have happened.").c_str());
			if (!checkPath(counterIncrements, counterDecrements, getInitialValue(), m_spec))
			{
				isOk = false;
				log << TestLog::Message << "No possible order of calls to atomicCounterIncrement(counter" << counterNdx << ") and atomicCounterDecrement(counter" << counterNdx << ") found." << TestLog::EndMessage;
			}
			else
				log << TestLog::Message << "Found possible order of calls to atomicCounterIncrement(counter" << counterNdx << ") and atomicCounterDecrement(counter" << counterNdx << ")." << TestLog::EndMessage;
		}
		else if ((m_spec.operations & OPERATION_INC) != 0)
		{
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check uniqueness and linearity").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only unique and linear values.").c_str());

				if (!checkUniquenessAndLinearity(log, counterIncrements))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned non unique values." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned only unique values." << TestLog::EndMessage;
			}

			if (isOk && ((m_spec.operations & OPERATION_GET) != 0))
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check range").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only values values between previous and next atomicCounter(counter" + de::toString(counterNdx) + ").").c_str());

				if (!checkRange(log, counterIncrements, counterPreGets, counterPostGets))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned value that is not between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned only values between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
			}
		}
		else if ((m_spec.operations & OPERATION_DEC) != 0)
		{
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check uniqueness and linearity").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only unique and linear values.").c_str());

				if (!checkUniquenessAndLinearity(log, counterDecrements))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned non unique values." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned only unique values." << TestLog::EndMessage;
			}

			if (isOk && ((m_spec.operations & OPERATION_GET) != 0))
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check range").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only values values between previous and next atomicCounter(counter" + de::toString(counterNdx) + ".").c_str());

				if (!checkRange(log, counterDecrements, counterPostGets, counterPreGets))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned value that is not between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned only values between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
			}
		}
	}

	return isOk;
}